

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderIndexingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  deUint32 dVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  int iVar5;
  uint uVar6;
  DataType DVar7;
  TestCaseGroup *pTVar8;
  char *pcVar9;
  ShaderIndexingCase *pSVar10;
  ShaderEvalFunc p_Var11;
  char *pcVar12;
  ostream *poVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  char *pcVar17;
  char *pcVar18;
  TestNode *pTVar19;
  string *psVar20;
  char *pcVar21;
  TestCaseGroup *pTVar22;
  long lVar23;
  code *evalFunc;
  long lVar24;
  bool bVar25;
  allocator<char> local_4a9;
  ulong local_4a8;
  ulong local_4a0;
  StringTemplate fragTemplate;
  int local_470;
  string vertexShaderSource;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  int local_400;
  string local_3f0;
  TestCaseGroup *local_3d0;
  TestCaseGroup *local_3c8;
  char *local_3c0;
  undefined8 local_3b8;
  TestNode *local_3b0;
  StringTemplate vertTemplate;
  string desc;
  string name;
  ostringstream vtx;
  ostringstream frag;
  
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar8,(this->super_TestCaseGroup).m_context,"varying_array",
             "Varying array access tests.");
  local_3d0 = pTVar8;
  local_3b0 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar8);
  for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
    local_4a8 = CONCAT44(local_4a8._4_4_,
                         Performance::ShaderOperatorTests::init()::floatTypes[lVar15]);
    uVar14 = 0;
    while (uVar14 != 4) {
      pcVar17 = "\tfor (int i = 0; i < ui_four; i++)\n";
      if (uVar14 == 2) {
        pcVar17 = "\tfor (int i = 0; i < 4; i++)\n";
      }
      pcVar18 = "uniform mediump int ui_four;\n";
      if (uVar14 == 1) {
        pcVar18 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
      }
      pcVar12 = (char *)(&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::s_names)
                        [uVar14];
      local_3b8 = (char *)(CONCAT44(local_3b8._4_4_,(int)uVar14) | 2);
      local_4a0 = uVar14;
      for (lVar24 = -0x20; lVar24 != 0; lVar24 = lVar24 + 8) {
        pcVar21 = *(char **)((long)&getVectorAccessTypeName(deqp::gles2::Functional::VectorAccessType)
                                    ::s_names + lVar24);
        pcVar9 = glu::getDataTypeName((DataType)local_4a8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragTemplate.m_template,pcVar9,(allocator<char> *)&vertexShaderSource)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                       &fragTemplate.m_template,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                       pcVar12);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate,"_write_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       pcVar21);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx,"_read");
        std::__cxx11::string::~string((string *)&vtx);
        std::__cxx11::string::~string((string *)&frag);
        std::__cxx11::string::~string((string *)&vertTemplate);
        std::__cxx11::string::~string((string *)&params);
        std::__cxx11::string::~string((string *)&fragTemplate);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,"Varying array with ",(allocator<char> *)&fragTemplate);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                       pcVar12);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate," write in vertex shader and ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       pcVar21);
        std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx," read in fragment shader.");
        std::__cxx11::string::~string((string *)&vtx);
        std::__cxx11::string::~string((string *)&frag);
        std::__cxx11::string::~string((string *)&vertTemplate);
        std::__cxx11::string::~string((string *)&params);
        _Var4 = name._M_dataplus;
        _Var3 = desc._M_dataplus;
        pCVar1 = (Context *)local_3b0[1]._vptr_TestNode;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
        std::operator<<((ostream *)&vtx,"attribute highp vec4 a_position;\n");
        std::operator<<((ostream *)&vtx,"attribute highp vec4 a_coords;\n");
        if ((DataType)local_3b8 == 3) {
          std::operator<<((ostream *)&vtx,pcVar18);
        }
        std::operator<<((ostream *)&vtx,"varying ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n");
        std::operator<<((ostream *)&vtx,"\n");
        std::operator<<((ostream *)&vtx,"void main()\n");
        std::operator<<((ostream *)&vtx,"{\n");
        std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
        if (local_4a0 == 0) {
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\tvar[0] = ${VAR_TYPE}(a_coords);\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\tvar[1] = ${VAR_TYPE}(a_coords) * 0.5;\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\tvar[2] = ${VAR_TYPE}(a_coords) * 0.25;\n");
          pcVar21 = "\tvar[3] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else if (local_4a0 == 1) {
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\tvar[ui_zero]  = ${VAR_TYPE}(a_coords);\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\tvar[ui_one]   = ${VAR_TYPE}(a_coords) * 0.5;\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\tvar[ui_two]   = ${VAR_TYPE}(a_coords) * 0.25;\n");
          pcVar21 = "\tvar[ui_three] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else {
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar17);
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\t{\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\t\tvar[i] = ${VAR_TYPE}(coords);\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\t\tcoords = coords * 0.5;\n");
          pcVar21 = "\t}\n";
        }
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar21);
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
        std::operator<<((ostream *)&frag,"precision mediump int;\n");
        pcVar21 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
        if ((lVar24 == -0x18) || (pcVar21 = "uniform int ui_four;\n", lVar24 == -8)) {
          std::operator<<((ostream *)&frag,pcVar21);
        }
        std::operator<<((ostream *)&frag,"varying ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n");
        std::operator<<((ostream *)&frag,"\n");
        std::operator<<((ostream *)&frag,"void main()\n");
        std::operator<<((ostream *)&frag,"{\n");
        std::operator<<((ostream *)&frag,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n");
        if (lVar24 == -0x20) {
          std::operator<<((ostream *)&frag,"\tres += var[0];\n");
          std::operator<<((ostream *)&frag,"\tres += var[1];\n");
          std::operator<<((ostream *)&frag,"\tres += var[2];\n");
          pcVar21 = "\tres += var[3];\n";
        }
        else if (lVar24 == -0x18) {
          std::operator<<((ostream *)&frag,"\tres += var[ui_zero];\n");
          std::operator<<((ostream *)&frag,"\tres += var[ui_one];\n");
          std::operator<<((ostream *)&frag,"\tres += var[ui_two];\n");
          pcVar21 = "\tres += var[ui_three];\n";
        }
        else {
          pcVar21 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar24 == -0x10) {
            pcVar21 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          std::operator<<((ostream *)&frag,pcVar21);
          pcVar21 = "\t\tres += var[i];\n";
        }
        std::operator<<((ostream *)&frag,pcVar21);
        std::operator<<((ostream *)&frag,"\tgl_FragColor = vec4(res${PADDING});\n");
        std::operator<<((ostream *)&frag,"}\n");
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &params._M_t._M_impl.super__Rb_tree_header._M_header;
        params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_4a8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_const_char_*,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [9])0x17d62f1,(char **)&fragTemplate);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x18164bb);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])0x1906f6b,(char (*) [8])0x18152ad);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        if ((DataType)local_4a8 == 3) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x17d30c1);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if ((DataType)local_4a8 == 2) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x17d30bc);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if ((DataType)local_4a8 == 1) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",
                     (char (*) [1])(glcts::fixed_sample_locations_values + 1));
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                   (allocator<char> *)&local_3f0);
        tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
        std::__cxx11::string::~string((string *)&fragTemplate.m_template);
        std::__cxx11::string::~string((string *)&vertexShaderSource);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vertexShaderSource,local_3f0._M_dataplus._M_p,&local_4a9);
        tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
        std::__cxx11::string::~string((string *)&vertexShaderSource);
        std::__cxx11::string::~string((string *)&local_3f0);
        tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
        tcu::StringTemplate::specialize(&local_3f0,&fragTemplate,&params);
        pSVar10 = (ShaderIndexingCase *)operator_new(0x130);
        uVar16 = (uint)(local_4a0 == 1 || lVar24 == -0x18);
        if (local_4a0 == 3) {
          uVar16 = 3;
        }
        dVar2 = uVar16 | 5;
        if (lVar24 != -8) {
          dVar2 = uVar16;
        }
        DVar7 = (DataType)local_4a8;
        p_Var11 = getArrayCoordsEvalFunc((DataType)local_4a8);
        ShaderIndexingCase::ShaderIndexingCase
                  (pSVar10,pCVar1,_Var4._M_p,_Var3._M_p,true,DVar7,p_Var11,dVar2,
                   vertexShaderSource._M_dataplus._M_p,local_3f0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&vertexShaderSource);
        tcu::StringTemplate::~StringTemplate(&fragTemplate);
        tcu::StringTemplate::~StringTemplate(&vertTemplate);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&params._M_t);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
        tcu::TestNode::addChild((TestNode *)local_3d0,(TestNode *)pSVar10);
        std::__cxx11::string::~string((string *)&desc);
        std::__cxx11::string::~string((string *)&name);
      }
      uVar14 = local_4a0 + 1;
    }
  }
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  pTVar19 = local_3b0;
  TestCaseGroup::TestCaseGroup
            (pTVar8,(Context *)local_3b0[1]._vptr_TestNode,"uniform_array",
             "Uniform array access tests.");
  tcu::TestNode::addChild(pTVar19,(TestNode *)pTVar8);
  lVar15 = 0;
  while (lVar15 != 4) {
    local_4a8 = (ulong)Performance::ShaderOperatorTests::init()::floatTypes[lVar15];
    uVar16 = Performance::ShaderOperatorTests::init()::floatTypes[lVar15] - TYPE_FLOAT;
    uVar14 = 0;
    local_3c8 = (TestCaseGroup *)lVar15;
    while (uVar14 != 4) {
      pcVar17 = (char *)(&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::s_names)
                        [uVar14];
      local_3c0 = "\tfor (int i = 0; i < ui_four; i++)\n";
      if (uVar14 == 2) {
        local_3c0 = "\tfor (int i = 0; i < 4; i++)\n";
      }
      pcVar18 = "uniform mediump int ui_four;\n";
      if (uVar14 == 1) {
        pcVar18 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
      }
      local_3d0 = (TestCaseGroup *)CONCAT44(local_3d0._4_4_,(uint)(uVar14 == 1));
      local_3b8 = (char *)(CONCAT44(local_3b8._4_4_,(int)uVar14) | 2);
      local_4a0 = uVar14;
      for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 4) {
        pcVar12 = glu::getShaderTypeName
                            (*(ShaderType *)
                              ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices +
                              lVar15));
        pcVar21 = glu::getDataTypeName((DataType)local_4a8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,pcVar21,(allocator<char> *)&fragTemplate);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                       "_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate,pcVar17);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       "_read_");
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx,pcVar12);
        std::__cxx11::string::~string((string *)&vtx);
        std::__cxx11::string::~string((string *)&frag);
        std::__cxx11::string::~string((string *)&vertTemplate);
        std::__cxx11::string::~string((string *)&params);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,"Uniform array with ",(allocator<char> *)&fragTemplate);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params,
                       pcVar17);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertTemplate," read in ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                       pcVar12);
        std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx," shader.");
        std::__cxx11::string::~string((string *)&vtx);
        std::__cxx11::string::~string((string *)&frag);
        std::__cxx11::string::~string((string *)&vertTemplate);
        std::__cxx11::string::~string((string *)&params);
        _Var4 = name._M_dataplus;
        _Var3 = desc._M_dataplus;
        pCVar1 = (Context *)local_3b0[1]._vptr_TestNode;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
        psVar20 = (string *)&frag;
        if (lVar15 == 0) {
          psVar20 = (string *)&vtx;
        }
        std::operator<<((ostream *)&vtx,"attribute highp vec4 a_position;\n");
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                        "attribute highp vec4 a_coords;\n");
        if (lVar15 == 0) {
          pcVar12 = "varying mediump vec4 v_color;\n";
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "varying mediump vec4 v_color;\n");
        }
        else {
          pcVar12 = "varying mediump vec4 v_coords;\n";
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "varying mediump vec4 v_coords;\n");
        }
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
        if ((DataType)local_3b8 == 3) {
          std::operator<<((ostream *)psVar20,pcVar18);
        }
        std::operator<<((ostream *)psVar20,"uniform ${PRECISION} ${VAR_TYPE} u_arr[${ARRAY_LEN}];\n"
                       );
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                        "\tgl_Position = a_position;\n");
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
        std::operator<<((ostream *)psVar20,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n");
        if (local_4a0 == 0) {
          std::operator<<((ostream *)psVar20,"\tres += u_arr[0];\n");
          std::operator<<((ostream *)psVar20,"\tres += u_arr[1];\n");
          std::operator<<((ostream *)psVar20,"\tres += u_arr[2];\n");
          pcVar12 = "\tres += u_arr[3];\n";
        }
        else if (local_4a0 == 1) {
          std::operator<<((ostream *)psVar20,"\tres += u_arr[ui_zero];\n");
          std::operator<<((ostream *)psVar20,"\tres += u_arr[ui_one];\n");
          std::operator<<((ostream *)psVar20,"\tres += u_arr[ui_two];\n");
          pcVar12 = "\tres += u_arr[ui_three];\n";
        }
        else {
          std::operator<<((ostream *)psVar20,local_3c0);
          pcVar12 = "\t\tres += u_arr[i];\n";
        }
        std::operator<<((ostream *)psVar20,pcVar12);
        if (lVar15 == 0) {
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\tv_color = vec4(res${PADDING});\n");
          pcVar12 = "\tgl_FragColor = v_color;\n";
        }
        else {
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\tv_coords = a_coords;\n");
          pcVar12 = "\tgl_FragColor = vec4(res${PADDING});\n";
        }
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
        std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
        std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &params._M_t._M_impl.super__Rb_tree_header._M_header;
        params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_4a8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_const_char_*,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [9])0x17d62f1,(char **)&fragTemplate);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x18164bb);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])0x1906f6b,(char (*) [8])0x18152ad);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        iVar5 = (int)local_4a8;
        if (iVar5 == 3) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x17d30c1);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (iVar5 == 2) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x17d30bc);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (iVar5 == 1) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",
                     (char (*) [1])(glcts::fixed_sample_locations_values + 1));
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&vertTemplate);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                   (allocator<char> *)&local_3f0);
        tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
        std::__cxx11::string::~string((string *)&fragTemplate.m_template);
        std::__cxx11::string::~string((string *)&vertexShaderSource);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vertexShaderSource,local_3f0._M_dataplus._M_p,&local_4a9);
        tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
        std::__cxx11::string::~string((string *)&vertexShaderSource);
        std::__cxx11::string::~string((string *)&local_3f0);
        tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
        tcu::StringTemplate::specialize(&local_3f0,&fragTemplate,&params);
        if (uVar16 < 4) {
          p_Var11 = (ShaderEvalFunc)(&PTR_evalArrayUniformFloat_01e1a140)[uVar16];
        }
        else {
          p_Var11 = (ShaderEvalFunc)0x0;
        }
        pSVar10 = (ShaderIndexingCase *)operator_new(0x130);
        bVar25 = lVar15 != 0;
        dVar2 = bVar25 + 3 + (uint)bVar25;
        if (local_4a0 != 3) {
          dVar2 = (deUint32)local_3d0;
        }
        ShaderIndexingCase::ShaderIndexingCase
                  (pSVar10,pCVar1,_Var4._M_p,_Var3._M_p,lVar15 == 0,(DataType)local_4a8,p_Var11,
                   dVar2,vertexShaderSource._M_dataplus._M_p,local_3f0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&vertexShaderSource);
        tcu::StringTemplate::~StringTemplate(&fragTemplate);
        tcu::StringTemplate::~StringTemplate(&vertTemplate);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&params);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
        tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pSVar10);
        std::__cxx11::string::~string((string *)&desc);
        std::__cxx11::string::~string((string *)&name);
      }
      uVar14 = local_4a0 + 1;
    }
    lVar15 = (long)local_3c8 + 1;
  }
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  pTVar19 = local_3b0;
  TestCaseGroup::TestCaseGroup
            (pTVar8,(Context *)local_3b0[1]._vptr_TestNode,"tmp_array",
             "Temporary array access tests.");
  tcu::TestNode::addChild(pTVar19,(TestNode *)pTVar8);
  lVar15 = 0;
  while (lVar15 != 4) {
    local_4a0 = CONCAT44(local_4a0._4_4_,
                         Performance::ShaderOperatorTests::init()::floatTypes[lVar15]);
    local_3c8 = (TestCaseGroup *)lVar15;
    for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
      pcVar17 = (char *)(&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::s_names)
                        [lVar24];
      local_3c0 = "\tfor (int i = 0; i < ui_four; i++)\n";
      if (lVar24 == 2) {
        local_3c0 = "\tfor (int i = 0; i < 4; i++)\n";
      }
      pTVar22 = (TestCaseGroup *)0x0;
      while (pTVar22 != (TestCaseGroup *)&DAT_00000004) {
        pcVar18 = (char *)(&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::
                            s_names)[(long)pTVar22];
        pcVar12 = "\tfor (int i = 0; i < ui_four; i++)\n";
        if (pTVar22 == (TestCaseGroup *)0x2) {
          pcVar12 = "\tfor (int i = 0; i < 4; i++)\n";
        }
        uVar16 = (uint)(pTVar22 == (TestCaseGroup *)&DAT_00000001 || lVar24 == 1);
        uVar14 = 0;
        local_3d0 = pTVar22;
        while (uVar14 != 8) {
          local_4a8 = uVar14;
          pcVar21 = glu::getShaderTypeName
                              (*(ShaderType *)
                                ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices
                                + uVar14));
          pcVar9 = glu::getDataTypeName((DataType)local_4a0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,pcVar9,(allocator<char> *)&local_3f0);
          std::operator+(&fragTemplate.m_template,&vertexShaderSource,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,&fragTemplate.m_template,pcVar17);
          std::operator+(&vertTemplate.m_template,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,"_write_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         &vertTemplate.m_template,pcVar18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         "_read_");
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vtx,pcVar21);
          std::__cxx11::string::~string((string *)&vtx);
          std::__cxx11::string::~string((string *)&frag);
          std::__cxx11::string::~string((string *)&vertTemplate.m_template);
          std::__cxx11::string::~string((string *)&params);
          std::__cxx11::string::~string((string *)&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,"Temporary array with ",
                     (allocator<char> *)&local_3f0);
          std::operator+(&fragTemplate.m_template,&vertexShaderSource,pcVar17);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,&fragTemplate.m_template," write and ");
          std::operator+(&vertTemplate.m_template,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,pcVar18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         &vertTemplate.m_template," read in ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         pcVar21);
          std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vtx," shader.");
          std::__cxx11::string::~string((string *)&vtx);
          std::__cxx11::string::~string((string *)&frag);
          std::__cxx11::string::~string((string *)&vertTemplate.m_template);
          std::__cxx11::string::~string((string *)&params);
          std::__cxx11::string::~string((string *)&fragTemplate);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          _Var4 = name._M_dataplus;
          _Var3 = desc._M_dataplus;
          pCVar1 = (Context *)local_3b0[1]._vptr_TestNode;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
          psVar20 = (string *)&frag;
          if (local_4a8 == 0) {
            psVar20 = (string *)&vtx;
          }
          std::operator<<((ostream *)&vtx,"attribute highp vec4 a_position;\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "attribute highp vec4 a_coords;\n");
          if (local_4a8 == 0) {
            pcVar21 = "varying mediump vec4 v_color;\n";
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "varying mediump vec4 v_color;\n");
          }
          else {
            pcVar21 = "varying mediump vec4 v_coords;\n";
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "varying mediump vec4 v_coords;\n");
          }
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar21);
          if (uVar16 != 0) {
            std::operator<<((ostream *)psVar20,
                            "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n");
          }
          if (pTVar22 == (TestCaseGroup *)0x3 || lVar24 == 3) {
            std::operator<<((ostream *)psVar20,"uniform mediump int ui_four;\n");
          }
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\tgl_Position = a_position;\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
          pcVar21 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
          if (local_4a8 == 0) {
            pcVar21 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
          }
          std::operator<<((ostream *)psVar20,pcVar21);
          std::operator<<((ostream *)psVar20,"\t${PRECISION} ${VAR_TYPE} arr[${ARRAY_LEN}];\n");
          if (lVar24 == 0) {
            std::operator<<((ostream *)psVar20,"\tarr[0] = ${VAR_TYPE}(coords);\n");
            std::operator<<((ostream *)psVar20,"\tarr[1] = ${VAR_TYPE}(coords) * 0.5;\n");
            std::operator<<((ostream *)psVar20,"\tarr[2] = ${VAR_TYPE}(coords) * 0.25;\n");
            pcVar21 = "\tarr[3] = ${VAR_TYPE}(coords) * 0.125;\n";
          }
          else if (lVar24 == 1) {
            std::operator<<((ostream *)psVar20,"\tarr[ui_zero]  = ${VAR_TYPE}(coords);\n");
            std::operator<<((ostream *)psVar20,"\tarr[ui_one]   = ${VAR_TYPE}(coords) * 0.5;\n");
            std::operator<<((ostream *)psVar20,"\tarr[ui_two]   = ${VAR_TYPE}(coords) * 0.25;\n");
            pcVar21 = "\tarr[ui_three] = ${VAR_TYPE}(coords) * 0.125;\n";
          }
          else {
            std::operator<<((ostream *)psVar20,local_3c0);
            std::operator<<((ostream *)psVar20,"\t{\n");
            std::operator<<((ostream *)psVar20,"\t\tarr[i] = ${VAR_TYPE}(coords);\n");
            std::operator<<((ostream *)psVar20,"\t\tcoords = coords * 0.5;\n");
            pcVar21 = "\t}\n";
          }
          std::operator<<((ostream *)psVar20,pcVar21);
          std::operator<<((ostream *)psVar20,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n")
          ;
          if (local_3d0 == (TestCaseGroup *)0x0) {
            std::operator<<((ostream *)psVar20,"\tres += arr[0];\n");
            std::operator<<((ostream *)psVar20,"\tres += arr[1];\n");
            std::operator<<((ostream *)psVar20,"\tres += arr[2];\n");
            pcVar21 = "\tres += arr[3];\n";
          }
          else if (local_3d0 == (TestCaseGroup *)&DAT_00000001) {
            std::operator<<((ostream *)psVar20,"\tres += arr[ui_zero];\n");
            std::operator<<((ostream *)psVar20,"\tres += arr[ui_one];\n");
            std::operator<<((ostream *)psVar20,"\tres += arr[ui_two];\n");
            pcVar21 = "\tres += arr[ui_three];\n";
          }
          else {
            std::operator<<((ostream *)psVar20,pcVar12);
            pcVar21 = "\t\tres += arr[i];\n";
          }
          std::operator<<((ostream *)psVar20,pcVar21);
          if (local_4a8 == 0) {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "\tv_color = vec4(res${PADDING});\n");
            pcVar21 = "\tgl_FragColor = v_color;\n";
          }
          else {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "\tv_coords = a_coords;\n");
            pcVar21 = "\tgl_FragColor = vec4(res${PADDING});\n";
          }
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar21);
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &params._M_t._M_impl.super__Rb_tree_header._M_header;
          params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_4a0);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[9],_const_char_*,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [9])0x17d62f1,(char **)&fragTemplate);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x18164bb);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])0x1906f6b,(char (*) [8])0x18152ad);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          if ((DataType)local_4a0 == 3) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x17d30c1);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else if ((DataType)local_4a0 == 2) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x17d30bc);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else if ((DataType)local_4a0 == 1) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",
                       (char (*) [1])(glcts::fixed_sample_locations_values + 1));
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                     (allocator<char> *)&local_3f0);
          tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,local_3f0._M_dataplus._M_p,&local_4a9);
          tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
          local_3b8 = _Var3._M_p;
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::string::~string((string *)&local_3f0);
          tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
          tcu::StringTemplate::specialize(&local_3f0,&fragTemplate,&params);
          pSVar10 = (ShaderIndexingCase *)operator_new(0x130);
          bVar25 = local_4a8 == 0;
          dVar2 = (uint)!bVar25 * 2 + 3;
          if (pTVar22 != (TestCaseGroup *)0x3 && lVar24 != 3) {
            dVar2 = uVar16;
          }
          DVar7 = (DataType)local_4a0;
          p_Var11 = getArrayCoordsEvalFunc((DataType)local_4a0);
          ShaderIndexingCase::ShaderIndexingCase
                    (pSVar10,pCVar1,_Var4._M_p,local_3b8,bVar25,DVar7,p_Var11,dVar2,
                     vertexShaderSource._M_dataplus._M_p,local_3f0._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          tcu::StringTemplate::~StringTemplate(&fragTemplate);
          tcu::StringTemplate::~StringTemplate(&vertTemplate);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&params._M_t);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
          tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pSVar10);
          std::__cxx11::string::~string((string *)&desc);
          std::__cxx11::string::~string((string *)&name);
          uVar14 = local_4a8 + 4;
        }
        pTVar22 = (TestCaseGroup *)
                  ((long)&(local_3d0->super_TestCaseGroup).super_TestNode._vptr_TestNode + 1);
      }
    }
    lVar15 = (long)local_3c8 + 1;
  }
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  pTVar19 = local_3b0;
  TestCaseGroup::TestCaseGroup
            (pTVar8,(Context *)local_3b0[1]._vptr_TestNode,"vector_subscript",
             "Vector subscript indexing.");
  local_3c8 = pTVar8;
  tcu::TestNode::addChild(pTVar19,(TestNode *)pTVar8);
  lVar15 = 0;
  do {
    if (lVar15 == 3) {
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar8,(Context *)pTVar19[1]._vptr_TestNode,"matrix_subscript",
                 "Matrix subscript indexing.");
      local_3c8 = pTVar8;
      tcu::TestNode::addChild(pTVar19,(TestNode *)pTVar8);
      lVar15 = 0;
      do {
        if (lVar15 == 3) {
          return 3;
        }
        local_4a0 = CONCAT44(local_4a0._4_4_,init::s_matrixTypes[lVar15]);
        for (local_3c0 = (char *)0x0; local_3c0 != (char *)0x4;
            local_3c0 = (char *)((long)local_3c0 + 1)) {
          pcVar17 = (char *)(&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::
                              s_names)[(long)local_3c0];
          for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
            bVar25 = local_3c0 == (char *)0x3;
            pcVar18 = (char *)(&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::
                                s_names)[lVar24];
            uVar16 = (uint)(lVar24 == 1 || local_3c0 == (char *)0x1);
            for (local_4a8 = 0; local_4a8 != 8; local_4a8 = local_4a8 + 4) {
              pcVar12 = glu::getShaderTypeName
                                  (*(ShaderType *)
                                    ((long)UniformCase::randomFeatures(unsigned_int)::
                                           arrayUsageChoices + local_4a8));
              pcVar21 = glu::getDataTypeName((DataType)local_4a0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar21,(allocator<char> *)&local_3f0);
              std::operator+(&fragTemplate.m_template,&vertexShaderSource,"_");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,&fragTemplate.m_template,pcVar17);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,"_write_");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&vertTemplate,pcVar18);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&frag,"_read_");
              std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&vtx,pcVar12);
              std::__cxx11::string::~string((string *)&vtx);
              std::__cxx11::string::~string((string *)&frag);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&params);
              std::__cxx11::string::~string((string *)&fragTemplate.m_template);
              std::__cxx11::string::~string((string *)&vertexShaderSource);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,"Vector subscript access with ",
                         (allocator<char> *)&local_3f0);
              std::operator+(&fragTemplate.m_template,&vertexShaderSource,pcVar17);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,&fragTemplate.m_template," write and ");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vertTemplate,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &params,pcVar18);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &frag,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&vertTemplate," read in ");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vtx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&frag,pcVar12);
              std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&vtx," shader.");
              std::__cxx11::string::~string((string *)&vtx);
              std::__cxx11::string::~string((string *)&frag);
              std::__cxx11::string::~string((string *)&vertTemplate);
              std::__cxx11::string::~string((string *)&params);
              std::__cxx11::string::~string((string *)&fragTemplate);
              std::__cxx11::string::~string((string *)&vertexShaderSource);
              _Var3 = desc._M_dataplus;
              pCVar1 = (Context *)local_3b0[1]._vptr_TestNode;
              local_3d0 = (TestCaseGroup *)name._M_dataplus._M_p;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              psVar20 = (string *)&frag;
              if (local_4a8 == 0) {
                psVar20 = (string *)&vtx;
              }
              uVar6 = glu::getDataTypeMatrixNumRows((DataType)local_4a0);
              pcVar12 = deqp::gls::getIntUniformName(uVar6);
              DVar7 = glu::getDataTypeFloatVec(uVar6);
              local_3b8 = (char *)CONCAT44(local_3b8._4_4_,DVar7);
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                              "attribute highp vec4 a_position;\n");
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                              "attribute highp vec4 a_coords;\n");
              if (local_4a8 == 0) {
                pcVar21 = "varying mediump vec4 v_color;\n";
                std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                "varying mediump vec4 v_color;\n");
              }
              else {
                pcVar21 = "varying mediump vec4 v_coords;\n";
                std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                "varying mediump vec4 v_coords;\n");
              }
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar21);
              if (uVar16 != 0) {
                std::operator<<((ostream *)psVar20,"uniform mediump int ui_zero");
                if (((1 < (int)uVar6) &&
                    (std::operator<<((ostream *)psVar20,", ui_one"), uVar6 != 2)) &&
                   (std::operator<<((ostream *)psVar20,", ui_two"), 3 < uVar6)) {
                  std::operator<<((ostream *)psVar20,", ui_three");
                }
                std::operator<<((ostream *)psVar20,";\n");
              }
              if (lVar24 == 3 || bVar25) {
                poVar13 = std::operator<<((ostream *)psVar20,"uniform mediump int ");
                poVar13 = std::operator<<(poVar13,pcVar12);
                std::operator<<(poVar13,";\n");
              }
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                              "void main()\n");
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                              "\tgl_Position = a_position;\n");
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                              "void main()\n");
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
              pcVar21 = "\t${PRECISION} vec4 coords = v_coords;\n";
              if (local_4a8 == 0) {
                pcVar21 = "\t${PRECISION} vec4 coords = a_coords;\n";
              }
              std::operator<<((ostream *)psVar20,pcVar21);
              std::operator<<((ostream *)psVar20,"\t${PRECISION} ${MAT_TYPE} tmp;\n");
              if (local_3c0 == (char *)0x0) {
                std::operator<<((ostream *)psVar20,"\ttmp[0] = ${VEC_TYPE}(coords);\n");
                if ((1 < (int)uVar6) &&
                   (std::operator<<((ostream *)psVar20,
                                    "\ttmp[1] = ${VEC_TYPE}(coords.yzwx) * 0.5;\n"), uVar6 != 2)) {
                  std::operator<<((ostream *)psVar20,"\ttmp[2] = ${VEC_TYPE}(coords.zwxy) * 0.25;\n"
                                 );
                  pcVar21 = "\ttmp[3] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
LAB_00e68126:
                  if (3 < uVar6) goto LAB_00e681b4;
                }
              }
              else if (local_3c0 == (char *)0x1) {
                std::operator<<((ostream *)psVar20,"\ttmp[ui_zero]  = ${VEC_TYPE}(coords);\n");
                if ((1 < (int)uVar6) &&
                   (std::operator<<((ostream *)psVar20,
                                    "\ttmp[ui_one]   = ${VEC_TYPE}(coords.yzwx) * 0.5;\n"),
                   uVar6 != 2)) {
                  std::operator<<((ostream *)psVar20,
                                  "\ttmp[ui_two]   = ${VEC_TYPE}(coords.zwxy) * 0.25;\n");
                  pcVar21 = "\ttmp[ui_three] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
                  goto LAB_00e68126;
                }
              }
              else {
                if (local_3c0 == (char *)0x2) {
                  poVar13 = std::operator<<((ostream *)psVar20,"\tfor (int i = 0; i < ");
                  poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar6);
                }
                else {
                  poVar13 = std::operator<<((ostream *)psVar20,"\tfor (int i = 0; i < ");
                  poVar13 = std::operator<<(poVar13,pcVar12);
                }
                std::operator<<(poVar13,"; i++)\n");
                std::operator<<((ostream *)psVar20,"\t{\n");
                std::operator<<((ostream *)psVar20,"\t\ttmp[i] = ${VEC_TYPE}(coords);\n");
                std::operator<<((ostream *)psVar20,"\t\tcoords = coords.yzwx * 0.5;\n");
                pcVar21 = "\t}\n";
LAB_00e681b4:
                std::operator<<((ostream *)psVar20,pcVar21);
              }
              std::operator<<((ostream *)psVar20,
                              "\t${PRECISION} ${VEC_TYPE} res = ${VEC_TYPE}(0.0);\n");
              if (lVar24 == 0) {
                std::operator<<((ostream *)psVar20,"\tres += tmp[0];\n");
                if ((1 < (int)uVar6) &&
                   (std::operator<<((ostream *)psVar20,"\tres += tmp[1];\n"), uVar6 != 2)) {
                  std::operator<<((ostream *)psVar20,"\tres += tmp[2];\n");
                  pcVar12 = "\tres += tmp[3];\n";
LAB_00e6826d:
                  if (3 < uVar6) goto LAB_00e682c7;
                }
              }
              else if (lVar24 == 1) {
                std::operator<<((ostream *)psVar20,"\tres += tmp[ui_zero];\n");
                if ((1 < (int)uVar6) &&
                   (std::operator<<((ostream *)psVar20,"\tres += tmp[ui_one];\n"), uVar6 != 2)) {
                  std::operator<<((ostream *)psVar20,"\tres += tmp[ui_two];\n");
                  pcVar12 = "\tres += tmp[ui_three];\n";
                  goto LAB_00e6826d;
                }
              }
              else {
                if (lVar24 == 2) {
                  poVar13 = std::operator<<((ostream *)psVar20,"\tfor (int i = 0; i < ");
                  poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar6);
                }
                else {
                  poVar13 = std::operator<<((ostream *)psVar20,"\tfor (int i = 0; i < ");
                  poVar13 = std::operator<<(poVar13,pcVar12);
                }
                std::operator<<(poVar13,"; i++)\n");
                pcVar12 = "\t\tres += tmp[i];\n";
LAB_00e682c7:
                std::operator<<((ostream *)psVar20,pcVar12);
              }
              if (local_4a8 == 0) {
                std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\tv_color = vec4(res${PADDING});\n");
                pcVar12 = "\tgl_FragColor = v_color;\n";
              }
              else {
                std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\tv_coords = a_coords;\n");
                pcVar12 = "\tgl_FragColor = vec4(res${PADDING});\n";
              }
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
              std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
              std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_4a0);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"MAT_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&vertTemplate);
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_3b8);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"VEC_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&vertTemplate);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x1906f6b,(char (*) [8])0x18152ad);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&vertTemplate);
              if (uVar6 == 3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x17d30c1);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (uVar6 == 2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x17d30bc);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",
                           (char (*) [1])(glcts::fixed_sample_locations_values + 1));
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&vertTemplate);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_3f0);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              std::__cxx11::string::~string((string *)&fragTemplate.m_template);
              std::__cxx11::string::~string((string *)&vertexShaderSource);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_3f0._M_dataplus._M_p,&local_4a9);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              std::__cxx11::string::~string((string *)&vertexShaderSource);
              std::__cxx11::string::~string((string *)&local_3f0);
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_3f0,&fragTemplate,&params);
              evalFunc = evalSubscriptMat2;
              if ((DataType)local_4a0 != 5) {
                if ((DataType)local_4a0 == 0xd) {
                  evalFunc = evalSubscriptMat4;
                }
                else if ((DataType)local_4a0 == 9) {
                  evalFunc = evalSubscriptMat3;
                }
                else {
                  evalFunc = (ShaderEvalFunc)0x0;
                }
              }
              pSVar10 = (ShaderIndexingCase *)operator_new(0x130);
              dVar2 = (uint)(local_4a8 != 0) * 2 + 3;
              if (lVar24 != 3 && !bVar25) {
                dVar2 = uVar16;
              }
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar10,pCVar1,(char *)local_3d0,_Var3._M_p,local_4a8 == 0,
                         (DataType)local_4a0,evalFunc,dVar2,vertexShaderSource._M_dataplus._M_p,
                         local_3f0._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&local_3f0);
              std::__cxx11::string::~string((string *)&vertexShaderSource);
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&params);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              tcu::TestNode::addChild((TestNode *)local_3c8,(TestNode *)pSVar10);
              std::__cxx11::string::~string((string *)&desc);
              std::__cxx11::string::~string((string *)&name);
            }
          }
        }
        lVar15 = lVar15 + 1;
      } while( true );
    }
    local_4a0 = (ulong)init::s_vectorTypes[lVar15];
    local_3c0 = (char *)(ulong)(init::s_vectorTypes[lVar15] - TYPE_FLOAT_VEC2);
    for (lVar24 = 0; lVar24 != 6; lVar24 = lVar24 + 1) {
      pcVar17 = (char *)(&getVectorAccessTypeName(deqp::gles2::Functional::VectorAccessType)::
                          s_names)[lVar24];
      for (lVar23 = 0; lVar23 != 6; lVar23 = lVar23 + 1) {
        pcVar18 = (char *)(&getVectorAccessTypeName(deqp::gles2::Functional::VectorAccessType)::
                            s_names)[lVar23];
        uVar16 = (uint)(lVar23 == 3 || lVar24 == 3);
        uVar14 = 0;
        while (uVar14 != 8) {
          local_4a8 = uVar14;
          pcVar12 = glu::getShaderTypeName
                              (*(ShaderType *)
                                ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices
                                + uVar14));
          pcVar21 = glu::getDataTypeName((DataType)local_4a0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,pcVar21,(allocator<char> *)&local_3f0);
          std::operator+(&fragTemplate.m_template,&vertexShaderSource,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,&fragTemplate.m_template,pcVar17);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,"_write_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,pcVar18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         "_read_");
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vtx,pcVar12);
          std::__cxx11::string::~string((string *)&vtx);
          std::__cxx11::string::~string((string *)&frag);
          std::__cxx11::string::~string((string *)&vertTemplate);
          std::__cxx11::string::~string((string *)&params);
          std::__cxx11::string::~string((string *)&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,"Vector subscript access with ",
                     (allocator<char> *)&local_3f0);
          std::operator+(&fragTemplate.m_template,&vertexShaderSource,pcVar17);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,&fragTemplate.m_template," write and ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &params,pcVar18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vertTemplate," read in ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                         pcVar12);
          std::operator+(&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vtx," shader.");
          std::__cxx11::string::~string((string *)&vtx);
          std::__cxx11::string::~string((string *)&frag);
          std::__cxx11::string::~string((string *)&vertTemplate);
          std::__cxx11::string::~string((string *)&params);
          std::__cxx11::string::~string((string *)&fragTemplate);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          _Var3 = name._M_dataplus;
          pTVar8 = (TestCaseGroup *)local_3b0[1]._vptr_TestNode;
          local_3b8 = desc._M_dataplus._M_p;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
          local_3d0 = pTVar8;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
          psVar20 = (string *)&frag;
          if (local_4a8 == 0) {
            psVar20 = (string *)&vtx;
          }
          uVar6 = glu::getDataTypeScalarSize((DataType)local_4a0);
          pcVar12 = deqp::gls::getIntUniformName(uVar6);
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "attribute highp vec4 a_position;\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "attribute highp vec4 a_coords;\n");
          if (local_4a8 == 0) {
            pcVar21 = "varying mediump vec3 v_color;\n";
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "varying mediump vec3 v_color;\n");
          }
          else {
            pcVar21 = "varying mediump vec4 v_coords;\n";
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "varying mediump vec4 v_coords;\n");
          }
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar21);
          if (uVar16 != 0) {
            std::operator<<((ostream *)psVar20,"uniform mediump int ui_zero");
            if (((1 < (int)uVar6) && (std::operator<<((ostream *)psVar20,", ui_one"), uVar6 != 2))
               && (std::operator<<((ostream *)psVar20,", ui_two"), 3 < uVar6)) {
              std::operator<<((ostream *)psVar20,", ui_three");
            }
            std::operator<<((ostream *)psVar20,";\n");
          }
          if (lVar23 == 5 || lVar24 == 5) {
            poVar13 = std::operator<<((ostream *)psVar20,"uniform mediump int ");
            poVar13 = std::operator<<(poVar13,pcVar12);
            std::operator<<(poVar13,";\n");
          }
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                          "\tgl_Position = a_position;\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n");
          pcVar21 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
          if (local_4a8 == 0) {
            pcVar21 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
          }
          std::operator<<((ostream *)psVar20,pcVar21);
          std::operator<<((ostream *)psVar20,"\t${PRECISION} ${VAR_TYPE} tmp;\n");
          pcVar21 = "\ttmp = coords.${SWIZZLE} * vec4(1.0, 0.5, 0.25, 0.125).${SWIZZLE};\n";
          local_470 = (int)lVar24;
          if (local_470 == 0) {
LAB_00e676a5:
            std::operator<<((ostream *)psVar20,pcVar21);
          }
          else if (local_470 == 2) {
            std::operator<<((ostream *)psVar20,"\ttmp[0] = coords.x;\n");
            if ((1 < (int)uVar6) &&
               (std::operator<<((ostream *)psVar20,"\ttmp[1] = coords.y * 0.5;\n"), uVar6 != 2)) {
              std::operator<<((ostream *)psVar20,"\ttmp[2] = coords.z * 0.25;\n");
              pcVar21 = "\ttmp[3] = coords.w * 0.125;\n";
LAB_00e67617:
              if (3 < uVar6) goto LAB_00e676a5;
            }
          }
          else if (local_470 == 1) {
            std::operator<<((ostream *)psVar20,"\ttmp.x = coords.x;\n");
            if ((1 < (int)uVar6) &&
               (std::operator<<((ostream *)psVar20,"\ttmp.y = coords.y * 0.5;\n"), uVar6 != 2)) {
              std::operator<<((ostream *)psVar20,"\ttmp.z = coords.z * 0.25;\n");
              pcVar21 = "\ttmp.w = coords.w * 0.125;\n";
              goto LAB_00e67617;
            }
          }
          else {
            if (lVar24 != 3) {
              if (lVar24 == 4) {
                poVar13 = std::operator<<((ostream *)psVar20,"\tfor (int i = 0; i < ");
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar6);
              }
              else {
                poVar13 = std::operator<<((ostream *)psVar20,"\tfor (int i = 0; i < ");
                poVar13 = std::operator<<(poVar13,pcVar12);
              }
              std::operator<<(poVar13,"; i++)\n");
              std::operator<<((ostream *)psVar20,"\t{\n");
              std::operator<<((ostream *)psVar20,"\t\ttmp[i] = coords.x;\n");
              std::operator<<((ostream *)psVar20,"\t\tcoords = coords.${ROT_SWIZZLE} * 0.5;\n");
              pcVar21 = "\t}\n";
              goto LAB_00e676a5;
            }
            std::operator<<((ostream *)psVar20,"\ttmp[ui_zero]  = coords.x;\n");
            if ((1 < (int)uVar6) &&
               (std::operator<<((ostream *)psVar20,"\ttmp[ui_one]   = coords.y * 0.5;\n"),
               uVar6 != 2)) {
              std::operator<<((ostream *)psVar20,"\ttmp[ui_two]   = coords.z * 0.25;\n");
              pcVar21 = "\ttmp[ui_three] = coords.w * 0.125;\n";
              goto LAB_00e67617;
            }
          }
          std::operator<<((ostream *)psVar20,"\t${PRECISION} float res = 0.0;\n");
          pcVar21 = "\tres = dot(tmp, ${VAR_TYPE}(1.0));\n";
          local_400 = (int)lVar23;
          if (local_400 == 0) {
LAB_00e67822:
            std::operator<<((ostream *)psVar20,pcVar21);
          }
          else if (local_400 == 2) {
            std::operator<<((ostream *)psVar20,"\tres += tmp[0];\n");
            if ((1 < (int)uVar6) &&
               (std::operator<<((ostream *)psVar20,"\tres += tmp[1];\n"), uVar6 != 2)) {
              std::operator<<((ostream *)psVar20,"\tres += tmp[2];\n");
              pcVar21 = "\tres += tmp[3];\n";
LAB_00e677c8:
              if (3 < uVar6) goto LAB_00e67822;
            }
          }
          else if (local_400 == 1) {
            std::operator<<((ostream *)psVar20,"\tres += tmp.x;\n");
            if ((1 < (int)uVar6) &&
               (std::operator<<((ostream *)psVar20,"\tres += tmp.y;\n"), uVar6 != 2)) {
              std::operator<<((ostream *)psVar20,"\tres += tmp.z;\n");
              pcVar21 = "\tres += tmp.w;\n";
              goto LAB_00e677c8;
            }
          }
          else {
            if (lVar23 != 3) {
              if (lVar23 == 4) {
                poVar13 = std::operator<<((ostream *)psVar20,"\tfor (int i = 0; i < ");
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar6);
              }
              else {
                poVar13 = std::operator<<((ostream *)psVar20,"\tfor (int i = 0; i < ");
                poVar13 = std::operator<<(poVar13,pcVar12);
              }
              std::operator<<(poVar13,"; i++)\n");
              pcVar21 = "\t\tres += tmp[i];\n";
              goto LAB_00e67822;
            }
            std::operator<<((ostream *)psVar20,"\tres += tmp[ui_zero];\n");
            if ((1 < (int)uVar6) &&
               (std::operator<<((ostream *)psVar20,"\tres += tmp[ui_one];\n"), uVar6 != 2)) {
              std::operator<<((ostream *)psVar20,"\tres += tmp[ui_two];\n");
              pcVar21 = "\tres += tmp[ui_three];\n";
              goto LAB_00e677c8;
            }
          }
          if (local_4a8 == 0) {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "\tv_color = vec3(res);\n");
            pcVar12 = "\tgl_FragColor = vec4(v_color, 1.0);\n";
          }
          else {
            std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                            "\tv_coords = a_coords;\n");
            pcVar12 = "\tgl_FragColor = vec4(vec3(res), 1.0);\n";
          }
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
          std::operator<<(&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
          std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &params._M_t._M_impl.super__Rb_tree_header._M_header;
          params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_4a0);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[9],_const_char_*,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [9])0x17d62f1,(char **)&fragTemplate);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])0x1906f6b,(char (*) [8])0x18152ad);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_*&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])0x16f959e,
                     (char **)(createVectorSubscriptCase(deqp::gles2::Context&,char_const*,char_const*,bool,glu::DataType,deqp::gles2::Functional::VectorAccessType,deqp::gles2::Functional::VectorAccessType)
                               ::s_swizzles + (long)(int)uVar6 * 8));
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[12],_const_char_*&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [12])"ROT_SWIZZLE",
                     (char **)(createVectorSubscriptCase(deqp::gles2::Context&,char_const*,char_const*,bool,glu::DataType,deqp::gles2::Functional::VectorAccessType,deqp::gles2::Functional::VectorAccessType)
                               ::s_rotSwizzles + (long)(int)uVar6 * 8));
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&vertTemplate);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                     (allocator<char> *)&local_3f0);
          tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&fragTemplate.m_template);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,local_3f0._M_dataplus._M_p,&local_4a9);
          tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          std::__cxx11::string::~string((string *)&local_3f0);
          tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
          tcu::StringTemplate::specialize(&local_3f0,&fragTemplate,&params);
          if ((uint)local_3c0 < 3) {
            p_Var11 = (ShaderEvalFunc)(&PTR_evalSubscriptVec2_01e1a160)[(long)local_3c0];
          }
          else {
            p_Var11 = (ShaderEvalFunc)0x0;
          }
          pSVar10 = (ShaderIndexingCase *)operator_new(0x130);
          dVar2 = (uint)(local_4a8 != 0) * 2 + 3;
          if (lVar23 != 5 && lVar24 != 5) {
            dVar2 = uVar16;
          }
          ShaderIndexingCase::ShaderIndexingCase
                    (pSVar10,(Context *)local_3d0,_Var3._M_p,local_3b8,local_4a8 == 0,
                     (DataType)local_4a0,p_Var11,dVar2,vertexShaderSource._M_dataplus._M_p,
                     local_3f0._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&vertexShaderSource);
          tcu::StringTemplate::~StringTemplate(&fragTemplate);
          tcu::StringTemplate::~StringTemplate(&vertTemplate);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&params);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
          tcu::TestNode::addChild((TestNode *)local_3c8,(TestNode *)pSVar10);
          std::__cxx11::string::~string((string *)&desc);
          std::__cxx11::string::~string((string *)&name);
          uVar14 = local_4a8 + 4;
        }
        pTVar19 = local_3b0;
      }
    }
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

void ShaderIndexingTests::init (void)
{
	static const ShaderType s_shaderTypes[] =
	{
		SHADERTYPE_VERTEX,
		SHADERTYPE_FRAGMENT
	};

	static const DataType s_floatAndVecTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4
	};

	// Varying array access cases.
	{
		TestCaseGroup* varyingGroup = new TestCaseGroup(m_context, "varying_array", "Varying array access tests.");
		addChild(varyingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string name = string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " + fragAccessName + " read in fragment shader.";
					varyingGroup->addChild(createVaryingArrayCase(m_context, name.c_str(), desc.c_str(), varType, (IndexAccessType)vertAccess, (IndexAccessType)fragAccess));
				}
			}
		}
	}

	// Uniform array access cases.
	{
		TestCaseGroup* uniformGroup = new TestCaseGroup(m_context, "uniform_array", "Uniform array access tests.");
		addChild(uniformGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					string		name			= string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string		desc			= string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					uniformGroup->addChild(createUniformArrayCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)readAccess));
				}
			}
		}
	}

	// Temporary array access cases.
	{
		TestCaseGroup* tmpGroup = new TestCaseGroup(m_context, "tmp_array", "Temporary array access tests.");
		addChild(tmpGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Temporary array with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						tmpGroup->addChild(createTmpArrayCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}

	// Vector indexing with subscripts.
	{
		TestCaseGroup* vecGroup = new TestCaseGroup(m_context, "vector_subscript", "Vector subscript indexing.");
		addChild(vecGroup);

		static const DataType s_vectorTypes[] =
		{
			TYPE_FLOAT_VEC2,
			TYPE_FLOAT_VEC3,
			TYPE_FLOAT_VEC4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < VECTORACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < VECTORACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getVectorAccessTypeName((VectorAccessType)writeAccess);
					const char* readAccessName = getVectorAccessTypeName((VectorAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						vecGroup->addChild(createVectorSubscriptCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (VectorAccessType)writeAccess, (VectorAccessType)readAccess));
					}
				}
			}
		}
	}

	// Matrix indexing with subscripts.
	{
		TestCaseGroup* matGroup = new TestCaseGroup(m_context, "matrix_subscript", "Matrix subscript indexing.");
		addChild(matGroup);

		static const DataType s_matrixTypes[] =
		{
			TYPE_FLOAT_MAT2,
			TYPE_FLOAT_MAT3,
			TYPE_FLOAT_MAT4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						matGroup->addChild(createMatrixSubscriptCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}
}